

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O1

int __thiscall jrtplib::RTPPacket::ParseRawPacket(RTPPacket *this,RTPRawPacket *rawpack)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  ushort *puVar6;
  int iVar7;
  byte bVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ushort *puVar12;
  
  iVar7 = -0x19;
  if ((rawpack->isrtp == true) && (uVar5 = rawpack->packetdatalength, 0xb < uVar5)) {
    puVar6 = (ushort *)rawpack->packetdata;
    uVar2 = *puVar6;
    if (((uVar2 & 0xc0) == 0x80) &&
       ((bVar8 = (byte)(uVar2 >> 8), -1 < (short)uVar2 || ((bVar8 & 0x7e) != 0x48)))) {
      if ((uVar2 & 0x20) == 0) {
        uVar11 = 0;
      }
      else {
        bVar1 = *(byte *)((long)puVar6 + (uVar5 - 1));
        uVar11 = (uint)bVar1;
        if (bVar1 == 0) {
          return -0x19;
        }
      }
      uVar4 = (uVar2 & 0xf) * 4;
      lVar9 = (ulong)uVar4 + 0xc;
      uVar10 = uVar2 & 0x10;
      if ((uVar2 & 0x10) == 0) {
        puVar12 = (ushort *)0x0;
      }
      else {
        uVar3 = *(ushort *)((long)puVar6 + (ulong)uVar4 + 0xe);
        puVar12 = (ushort *)((long)puVar6 + lVar9);
        lVar9 = (ulong)(ushort)uVar4 + (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8) * 4 + 0x10;
      }
      uVar11 = (int)uVar5 - (uVar11 + (int)lVar9);
      if (-1 < (int)uVar11) {
        this->hasextension = SUB41(uVar10 >> 4,0);
        if ((short)uVar10 != 0) {
          this->extid = *puVar12 << 8 | *puVar12 >> 8;
          this->extensionlength = (ulong)(ushort)(puVar12[1] << 8 | puVar12[1] >> 8) << 2;
          this->extension = (uint8_t *)(puVar12 + 2);
        }
        this->hasmarker = (bool)(bVar8 >> 7);
        this->numcsrcs = uVar2 & 0xf;
        this->payloadtype = bVar8 & 0x7f;
        this->extseqnr = (uint)(ushort)(puVar6[1] << 8 | puVar6[1] >> 8);
        uVar4 = *(uint *)(puVar6 + 2);
        this->timestamp =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        uVar4 = *(uint *)(puVar6 + 4);
        this->ssrc = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
        ;
        this->packet = (uint8_t *)puVar6;
        this->payload = (uint8_t *)(lVar9 + (long)puVar6);
        this->packetlength = uVar5;
        this->payloadlength = (ulong)(uVar11 & 0x7fffffff);
        rawpack->packetdata = (uint8_t *)0x0;
        rawpack->packetdatalength = 0;
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int RTPPacket::ParseRawPacket(RTPRawPacket &rawpack)
{
	uint8_t *packetbytes;
	size_t packetlen;
	uint8_t payloadtype;
	RTPHeader *rtpheader;
	bool marker;
	int csrccount;
	bool hasextension;
	int payloadoffset,payloadlength;
	int numpadbytes;
	RTPExtensionHeader *rtpextheader;
	
	if (!rawpack.IsRTP()) // If we didn't receive it on the RTP port, we'll ignore it
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	// The length should be at least the size of the RTP header
	packetlen = rawpack.GetDataLength();
	if (packetlen < sizeof(RTPHeader))
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	packetbytes = (uint8_t *)rawpack.GetData();
	rtpheader = (RTPHeader *)packetbytes;
	
	// The version number should be correct
	if (rtpheader->version != RTP_VERSION)
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	// We'll check if this is possibly a RTCP packet. For this to be possible
	// the marker bit and payload type combined should be either an SR or RR
	// identifier
	marker = (rtpheader->marker == 0)?false:true;
	payloadtype = rtpheader->payloadtype;
	if (marker)
	{
		if (payloadtype == (RTP_RTCPTYPE_SR & 127)) // don't check high bit (this was the marker!!)
			return ERR_RTP_PACKET_INVALIDPACKET;
		if (payloadtype == (RTP_RTCPTYPE_RR & 127))
			return ERR_RTP_PACKET_INVALIDPACKET;
	}

	csrccount = rtpheader->csrccount;
	payloadoffset = sizeof(RTPHeader)+(int)(csrccount*sizeof(uint32_t));
	
	if (rtpheader->padding) // adjust payload length to take padding into account
	{
		numpadbytes = (int)packetbytes[packetlen-1]; // last byte contains number of padding bytes
		if (numpadbytes <= 0)
			return ERR_RTP_PACKET_INVALIDPACKET;
	}
	else
		numpadbytes = 0;

	hasextension = (rtpheader->extension == 0)?false:true;
	if (hasextension) // got header extension
	{
		rtpextheader = (RTPExtensionHeader *)(packetbytes+payloadoffset);
		payloadoffset += sizeof(RTPExtensionHeader);
		
		uint16_t exthdrlen = ntohs(rtpextheader->length);
		payloadoffset += ((int)exthdrlen)*sizeof(uint32_t);
	}
	else
	{
		rtpextheader = 0;
	}	
	
	payloadlength = packetlen-numpadbytes-payloadoffset;
	if (payloadlength < 0)
		return ERR_RTP_PACKET_INVALIDPACKET;

	// Now, we've got a valid packet, so we can create a new instance of RTPPacket
	// and fill in the members
	
	RTPPacket::hasextension = hasextension;
	if (hasextension)
	{
		RTPPacket::extid = ntohs(rtpextheader->extid);
		RTPPacket::extensionlength = ((int)ntohs(rtpextheader->length))*sizeof(uint32_t);
		RTPPacket::extension = ((uint8_t *)rtpextheader)+sizeof(RTPExtensionHeader);
	}

	RTPPacket::hasmarker = marker;
	RTPPacket::numcsrcs = csrccount;
	RTPPacket::payloadtype = payloadtype;
	
	// Note: we don't fill in the EXTENDED sequence number here, since we
	// don't have information about the source here. We just fill in the low
	// 16 bits
	RTPPacket::extseqnr = (uint32_t)ntohs(rtpheader->sequencenumber);

	RTPPacket::timestamp = ntohl(rtpheader->timestamp);
	RTPPacket::ssrc = ntohl(rtpheader->ssrc);
	RTPPacket::packet = packetbytes;
	RTPPacket::payload = packetbytes+payloadoffset;
	RTPPacket::packetlength = packetlen;
	RTPPacket::payloadlength = payloadlength;

	// We'll zero the data of the raw packet, since we're using it here now!
	rawpack.ZeroData();

	return 0;
}